

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O1

duckdb_type duckdb_decimal_internal_type(duckdb_logical_type type)

{
  _duckdb_logical_type _Var1;
  duckdb_type dVar2;
  
  dVar2 = DUCKDB_TYPE_INVALID;
  if ((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x15)) {
    _Var1 = type[1];
    if ((byte)_Var1 < 9) {
      if (_Var1 == (_duckdb_logical_type)0x5) {
        return DUCKDB_TYPE_SMALLINT;
      }
      if (_Var1 == (_duckdb_logical_type)0x7) {
        return DUCKDB_TYPE_INTEGER;
      }
    }
    else {
      if (_Var1 == (_duckdb_logical_type)0x9) {
        return DUCKDB_TYPE_BIGINT;
      }
      if (_Var1 == (_duckdb_logical_type)0xcc) {
        dVar2 = DUCKDB_TYPE_HUGEINT;
      }
    }
  }
  return dVar2;
}

Assistant:

duckdb_type duckdb_decimal_internal_type(duckdb_logical_type type) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::DECIMAL)) {
		return DUCKDB_TYPE_INVALID;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	switch (logical_type.InternalType()) {
	case duckdb::PhysicalType::INT16:
		return DUCKDB_TYPE_SMALLINT;
	case duckdb::PhysicalType::INT32:
		return DUCKDB_TYPE_INTEGER;
	case duckdb::PhysicalType::INT64:
		return DUCKDB_TYPE_BIGINT;
	case duckdb::PhysicalType::INT128:
		return DUCKDB_TYPE_HUGEINT;
	default:
		return DUCKDB_TYPE_INVALID;
	}
}